

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

ssize_t __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write
          (xml_buffered_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  ulong size;
  
  size = this->bufsize;
  if (0x7fa < size) {
    flush(this,this->buffer,size);
    this->bufsize = 0;
    size = 0;
    in_RAX = extraout_RAX;
  }
  this->buffer[size] = '&';
  this->buffer[size + 1] = (char_t)__fd;
  this->buffer[size + 2] = (char_t)__buf;
  this->buffer[size + 3] = 'o';
  this->buffer[size + 4] = (char_t)__n;
  this->buffer[size + 5] = ';';
  this->bufsize = size + 6;
  return in_RAX;
}

Assistant:

void write(char_t d0, char_t d1, char_t d2, char_t d3, char_t d4, char_t d5)
		{
			size_t offset = bufsize;
			if (offset > bufcapacity - 6) offset = flush();

			buffer[offset + 0] = d0;
			buffer[offset + 1] = d1;
			buffer[offset + 2] = d2;
			buffer[offset + 3] = d3;
			buffer[offset + 4] = d4;
			buffer[offset + 5] = d5;
			bufsize = offset + 6;
		}